

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void __thiscall lda::expdigammify_2(lda *this,vw *all,float *gamma,float *norm)

{
  lda_math_mode lVar1;
  ostream *poVar2;
  
  lVar1 = this->mmode;
  if (lVar1 == USE_SIMD) {
    ldamath::vexpdigammify_2(all,gamma,norm,1e-10);
    return;
  }
  if (lVar1 != USE_PRECISE) {
    if (lVar1 == USE_FAST_APPROX) {
      ldamath::expdigammify_2<float,(lda_math_mode)2>(all,gamma,norm,1e-10);
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "lda::expdigammify_2: Trampled or invalid math mode, aborting");
    std::endl<char,std::char_traits<char>>(poVar2);
    abort();
  }
  ldamath::expdigammify_2<float,(lda_math_mode)1>(all,gamma,norm,1e-10);
  return;
}

Assistant:

void lda::expdigammify_2(vw &all, float *gamma, float *norm)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      ldamath::expdigammify_2<float, USE_FAST_APPROX>(all, gamma, norm, underflow_threshold());
      break;
    case USE_PRECISE:
      ldamath::expdigammify_2<float, USE_PRECISE>(all, gamma, norm, underflow_threshold());
      break;
    case USE_SIMD:
      ldamath::expdigammify_2<float, USE_SIMD>(all, gamma, norm, underflow_threshold());
      break;
    default:
      std::cerr << "lda::expdigammify_2: Trampled or invalid math mode, aborting" << std::endl;
      abort();
  }
}